

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateIsInitialized
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CppType CVar4;
  char *__s;
  Descriptor *type;
  int index_00;
  ulong uVar5;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  FieldDescriptor *field_00;
  string local_f8;
  string local_d8;
  FieldDescriptor *local_b8;
  FieldDescriptor *field_1;
  allocator<char> local_a5;
  int i_1;
  string local_98;
  string local_78;
  char local_58 [8];
  char buffer [32];
  FieldDescriptor *field;
  int local_28;
  int index;
  int bit;
  uint32 mask;
  int i;
  int has_bits_array_size;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  io::Printer::Print(printer,"bool $classname$::IsInitialized() const {\n","classname",
                     &this->classname_);
  io::Printer::Indent(printer);
  iVar2 = Descriptor::field_count(this->descriptor_);
  uVar5 = (long)(iVar2 + 0x1f) % 0x20 & 0xffffffff;
  bit = 0;
  do {
    if ((iVar2 + 0x1f) / 0x20 <= bit) {
      io::Printer::Print(printer,"\n");
      for (field_1._4_4_ = 0; iVar2 = field_1._4_4_,
          iVar3 = Descriptor::field_count(this->descriptor_), iVar2 < iVar3;
          field_1._4_4_ = field_1._4_4_ + 1) {
        local_b8 = Descriptor::field(this->descriptor_,field_1._4_4_);
        CVar4 = FieldDescriptor::cpp_type(local_b8);
        if ((CVar4 == CPPTYPE_MESSAGE) &&
           (bVar1 = anon_unknown_0::ShouldIgnoreRequiredFieldCheck(local_b8), !bVar1)) {
          type = FieldDescriptor::message_type(local_b8);
          bVar1 = anon_unknown_0::HasRequiredFields(type);
          if (bVar1) {
            bVar1 = FieldDescriptor::is_repeated(local_b8);
            if (bVar1) {
              FieldName_abi_cxx11_(&local_d8,(cxx *)local_b8,field_00);
              io::Printer::Print(printer,
                                 "for (int i = 0; i < $name$_size(); i++) {\n  if (!this->$name$(i).IsInitialized()) return false;\n}\n"
                                 ,"name",&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
            }
            else {
              FieldName_abi_cxx11_(&local_f8,(cxx *)local_b8,field_00);
              io::Printer::Print(printer,
                                 "if (has_$name$()) {\n  if (!this->$name$().IsInitialized()) return false;\n}\n"
                                 ,"name",&local_f8);
              std::__cxx11::string::~string((string *)&local_f8);
            }
          }
        }
      }
      iVar2 = Descriptor::extension_range_count(this->descriptor_);
      if (0 < iVar2) {
        io::Printer::Print(printer,"\nif (!_extensions_.IsInitialized()) return false;");
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  return true;\n}\n");
      return;
    }
    index = 0;
    for (local_28 = 0; local_28 < 0x20; local_28 = local_28 + 1) {
      index_00 = bit * 0x20 + local_28;
      iVar3 = Descriptor::field_count(this->descriptor_);
      uVar5 = extraout_RDX;
      if (iVar3 <= index_00) break;
      buffer._24_8_ = Descriptor::field(this->descriptor_,index_00);
      bVar1 = FieldDescriptor::is_required((FieldDescriptor *)buffer._24_8_);
      if (bVar1) {
        index = 1 << ((byte)local_28 & 0x1f) | index;
      }
      uVar5 = extraout_RDX_00;
    }
    if (index != 0) {
      SimpleItoa_abi_cxx11_(&local_78,(protobuf *)(ulong)(uint)bit,(int)uVar5);
      __s = FastHex32ToBuffer(index,local_58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,__s,&local_a5);
      io::Printer::Print(printer,"if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n","i"
                         ,&local_78,"mask",&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_a5);
      std::__cxx11::string::~string((string *)&local_78);
      uVar5 = extraout_RDX_01;
    }
    bit = bit + 1;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateIsInitialized(io::Printer* printer) {
  printer->Print(
    "bool $classname$::IsInitialized() const {\n",
    "classname", classname_);
  printer->Indent();

  // Check that all required fields in this message are set.  We can do this
  // most efficiently by checking 32 "has bits" at a time.
  int has_bits_array_size = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < has_bits_array_size; i++) {
    uint32 mask = 0;
    for (int bit = 0; bit < 32; bit++) {
      int index = i * 32 + bit;
      if (index >= descriptor_->field_count()) break;
      const FieldDescriptor* field = descriptor_->field(index);

      if (field->is_required()) {
        mask |= 1 << bit;
      }
    }

    if (mask != 0) {
      char buffer[kFastToBufferSize];
      printer->Print(
        "if ((_has_bits_[$i$] & 0x$mask$) != 0x$mask$) return false;\n",
        "i", SimpleItoa(i),
        "mask", FastHex32ToBuffer(mask, buffer));
    }
  }

  // Now check that all embedded messages are initialized.
  printer->Print("\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !ShouldIgnoreRequiredFieldCheck(field) &&
        HasRequiredFields(field->message_type())) {
      if (field->is_repeated()) {
        printer->Print(
          "for (int i = 0; i < $name$_size(); i++) {\n"
          "  if (!this->$name$(i).IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      } else {
        printer->Print(
          "if (has_$name$()) {\n"
          "  if (!this->$name$().IsInitialized()) return false;\n"
          "}\n",
          "name", FieldName(field));
      }
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "\n"
      "if (!_extensions_.IsInitialized()) return false;");
  }

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}